

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

int IoCommandWriteBlif(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Ntk_t *pNtk;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uint fUseHie;
  char *pcVar4;
  char *pcVar5;
  char *local_38;
  
  local_38 = (char *)0x0;
  Extra_UtilGetoptReset();
  bVar1 = false;
  fUseHie = 0;
  do {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"Sjah"), iVar2 == 0x61) {
        fUseHie = fUseHie ^ 1;
      }
      if (iVar2 == -1) {
        pNtk = pAbc->pNtkCur;
        if (pNtk == (Abc_Ntk_t *)0x0) {
          fwrite("Empty network.\n",0xf,1,(FILE *)pAbc->Out);
        }
        else {
          if (globalUtilOptind + 1 != argc) goto LAB_002c3027;
          if ((bVar1) || (local_38 != (char *)0x0)) {
            Io_WriteBlifSpecial(pNtk,argv[globalUtilOptind],local_38,fUseHie);
          }
          else {
            Io_Write(pNtk,argv[globalUtilOptind],IO_FILE_BLIF);
          }
        }
        return 0;
      }
      if (iVar2 != 0x6a) break;
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar2 != 0x53) goto LAB_002c3027;
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-S\" should be followed by string.\n";
      goto LAB_002c3149;
    }
    local_38 = argv[globalUtilOptind];
    globalUtilOptind = globalUtilOptind + 1;
    sVar3 = strlen(local_38);
  } while ((sVar3 & 0xfffffffffffffffe) == 2);
  pcVar4 = 
  "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n"
  ;
LAB_002c3149:
  Abc_Print(-1,pcVar4);
LAB_002c3027:
  fwrite("usage: write_blif [-S str] [-jah] <file>\n",0x29,1,(FILE *)pAbc->Err);
  fwrite("\t         writes the network into a BLIF file\n",0x2e,1,(FILE *)pAbc->Err);
  pcVar4 = "not used";
  if (local_38 != (char *)0x0) {
    pcVar4 = local_38;
  }
  fprintf((FILE *)pAbc->Err,"\t-S str : string representing the LUT structure [default = %s]\n",
          pcVar4);
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (!bVar1) {
    pcVar4 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-j     : enables special BLIF writing [default = %s]\n",pcVar4);
  if (fUseHie == 0) {
    pcVar5 = "no";
  }
  fprintf((FILE *)pAbc->Err,
          "\t-a     : enables hierarchical BLIF writing for LUT structures [default = %s]\n",pcVar5)
  ;
  fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
  fwrite("\tfile   : the name of the file to write (extension .blif)\n",0x3a,1,(FILE *)pAbc->Err);
  return 1;
}

Assistant:

int IoCommandWriteBlif( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
    char * pLutStruct = NULL;
    int c, fSpecial = 0;
    int fUseHie = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Sjah" ) ) != EOF )
    {
        switch ( c )
        {
            case 'S':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-S\" should be followed by string.\n" );
                    goto usage;
                }
                pLutStruct = argv[globalUtilOptind];
                globalUtilOptind++;
                if ( strlen(pLutStruct) != 2 && strlen(pLutStruct) != 3 ) 
                {
                    Abc_Print( -1, "Command line switch \"-S\" should be followed by a 2- or 3-char string (e.g. \"44\" or \"555\").\n" );
                    goto usage;
                }
                break;
            case 'j':
                fSpecial ^= 1;
                break;
            case 'a':
                fUseHie ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the corresponding file writer
    if ( fSpecial || pLutStruct )
        Io_WriteBlifSpecial( pAbc->pNtkCur, pFileName, pLutStruct, fUseHie );
    else
        Io_Write( pAbc->pNtkCur, pFileName, IO_FILE_BLIF );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_blif [-S str] [-jah] <file>\n" );
    fprintf( pAbc->Err, "\t         writes the network into a BLIF file\n" );
    fprintf( pAbc->Err, "\t-S str : string representing the LUT structure [default = %s]\n", pLutStruct ? pLutStruct : "not used" );  
    fprintf( pAbc->Err, "\t-j     : enables special BLIF writing [default = %s]\n", fSpecial? "yes" : "no" );;
    fprintf( pAbc->Err, "\t-a     : enables hierarchical BLIF writing for LUT structures [default = %s]\n", fUseHie? "yes" : "no" );;
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write (extension .blif)\n" );
    return 1;
}